

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::BlobProtoVector::ByteSizeLong(BlobProtoVector *this)

{
  uint uVar1;
  int iVar2;
  UnknownFieldSet *unknown_fields;
  BlobProto *value;
  size_t sVar3;
  uint local_30;
  int cached_size;
  uint i;
  uint count;
  size_t total_size;
  BlobProtoVector *this_local;
  
  _i = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = BlobProtoVector::unknown_fields(this);
    _i = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar1 = blobs_size(this);
  _i = uVar1 + _i;
  for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
    value = blobs(this,local_30);
    sVar3 = google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual<caffe::BlobProto>
                      (value);
    _i = sVar3 + _i;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar2;
  return _i;
}

Assistant:

size_t BlobProtoVector::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.BlobProtoVector)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .caffe.BlobProto blobs = 1;
  {
    unsigned int count = this->blobs_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->blobs(i));
    }
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}